

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

xr_clsid * __thiscall xr_entity_factory::get_entity_clsid(xr_entity_factory *this,char *name)

{
  bool bVar1;
  xr_ini_file *this_00;
  uint64_t clsid_00;
  reference ppfVar2;
  xr_clsid *this_01;
  bool local_79;
  xr_clsid *temp;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 local_58;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  local_50;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  local_48;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  local_40;
  iterator it;
  xr_clsid clsid;
  char *name_local;
  xr_entity_factory *this_local;
  
  if (this->m_system_ini == (xr_ini_file *)0x0) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    xray_re::xr_ini_file::xr_ini_file(this_00,"$game_config$","system.ltx");
    this->m_system_ini = this_00;
  }
  bVar1 = xray_re::xr_ini_file::section_exist(this->m_system_ini,name);
  if (bVar1) {
    clsid_00 = xray_re::xr_ini_file::r_clsid(this->m_system_ini,name,"class");
    xray_re::xr_clsid::xr_clsid((xr_clsid *)&it,clsid_00);
    local_48._M_current =
         (factory_item_base **)
         std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::begin
                   (&this->m_clsids);
    local_50._M_current =
         (factory_item_base **)
         std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::end
                   (&this->m_clsids);
    clsid_pred2::clsid_pred2((clsid_pred2 *)&local_58,(xr_clsid *)&it);
    local_40 = xray_re::
               lower_bound_if<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,clsid_pred2>
                         (local_48,local_50,(clsid_pred2)local_58);
    temp = (xr_clsid *)
           std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::end
                     (&this->m_clsids);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                        *)&temp);
    local_79 = false;
    if (bVar1) {
      ppfVar2 = __gnu_cxx::
                __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                ::operator*(&local_40);
      this_01 = factory_item_base::clsid(*ppfVar2);
      local_79 = xray_re::xr_clsid::operator==(this_01,(xr_clsid *)&it);
    }
    if (local_79 != false) {
      return (xr_clsid *)&it;
    }
  }
  return (xr_clsid *)0x0;
}

Assistant:

xr_clsid* xr_entity_factory::get_entity_clsid(const char* name)
{
	if (m_system_ini == 0)
		m_system_ini = new xr_ini_file(PA_GAME_CONFIG, "system.ltx");
  
	if (m_system_ini->section_exist(name)) {
		xr_clsid clsid(m_system_ini->r_clsid(name, "class"));
		std::vector<factory_item_base*>::iterator it = lower_bound_if(
				m_clsids.begin(), m_clsids.end(), clsid_pred2(clsid));
		if (it != m_clsids.end() && (*it)->clsid() == clsid)
		{
			xr_clsid* temp = &clsid;
			return temp;
		}
	}

	return NULL;
}